

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O0

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)

{
  DataChunk rhs;
  RF64Chunk rhs_00;
  ExtensibleFmtChunk rhs_01;
  DS64Chunk rhs_02;
  BextChunk rhs_03;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 local_598;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 uVar7;
  char in_stack_fffffffffffffa7c [4];
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffaac;
  undefined4 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab4 [548];
  undefined8 in_stack_fffffffffffffcd8;
  undefined8 local_318 [78];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined8 local_18;
  RF64Header *local_10;
  RF64Header *wavHeader_local;
  
  bVar4 = 0;
  local_598 = *(undefined8 *)&wavHeader->RF64Chunk;
  local_18 = *(undefined8 *)((long)&(wavHeader->RF64Chunk).ckSize + 4);
  rhs_00.ckSize._4_4_ = in_stack_fffffffffffffa78;
  rhs_00._0_8_ = local_18;
  rhs_00.rf64Type = in_stack_fffffffffffffa7c;
  local_20 = local_598;
  local_10 = wavHeader;
  PrintRF64Chunk(rhs_00);
  memcpy(&local_68,&local_10->DS64Chunk,0x44);
  local_598 = local_68;
  rhs_02.ckSize._4_4_ = (int)local_58;
  rhs_02._0_8_ = uStack_60;
  rhs_02.RIFFSizeLow._0_4_ = (int)((ulong)local_58 >> 0x20);
  rhs_02._16_8_ = uStack_50;
  rhs_02._24_8_ = local_48;
  rhs_02._32_8_ = uStack_40;
  rhs_02._40_8_ = local_38;
  rhs_02._48_8_ = uStack_30;
  rhs_02.SampleCountHigh._4_4_ = local_28;
  rhs_02.TableLength._0_4_ = in_stack_fffffffffffffaac;
  rhs_02.TableLength._4_4_ = in_stack_fffffffffffffab0;
  PrintDS64Chunk(rhs_02);
  memcpy(&local_a8,&local_10->fmtChunk,0x40);
  uVar7 = (undefined4)local_98;
  uVar8 = (undefined4)((ulong)local_98 >> 0x20);
  local_598 = local_a8;
  uVar5 = (undefined4)uStack_a0;
  uVar6 = (undefined4)((ulong)uStack_a0 >> 0x20);
  rhs_01.standardFmtChunk.ckSize._4_4_ = uVar7;
  rhs_01.standardFmtChunk._0_8_ = uStack_a0;
  rhs_01.standardFmtChunk.wFormatTag = (short)uVar8;
  rhs_01.standardFmtChunk.nChannels = (short)((uint)uVar8 >> 0x10);
  rhs_01.standardFmtChunk.nSamplesPerSec = uStack_90;
  rhs_01.standardFmtChunk.nAvgBytesPerSec = local_88;
  rhs_01.standardFmtChunk.nBlockAlign = (undefined2)uStack_80;
  rhs_01.standardFmtChunk.wBitsPerSample = uStack_80._2_2_;
  rhs_01.cbSize = uStack_80._4_2_;
  rhs_01.wValidBitsPerSample = uStack_80._6_2_;
  rhs_01.dwChannelMask = local_78;
  rhs_01.SubFormat[0] = (undefined1)uStack_70;
  rhs_01.SubFormat[1] = uStack_70._1_1_;
  rhs_01.SubFormat[2] = uStack_70._2_1_;
  rhs_01.SubFormat[3] = uStack_70._3_1_;
  rhs_01.SubFormat[4] = uStack_70._4_1_;
  rhs_01.SubFormat[5] = uStack_70._5_1_;
  rhs_01.SubFormat[6] = uStack_70._6_1_;
  rhs_01.SubFormat[7] = uStack_70._7_1_;
  rhs_01.SubFormat[8] = (char)local_28;
  rhs_01.SubFormat[9] = (char)((uint)local_28 >> 8);
  rhs_01.SubFormat[10] = (char)((uint)local_28 >> 0x10);
  rhs_01.SubFormat[0xb] = (char)((uint)local_28 >> 0x18);
  rhs_01.SubFormat[0xc] = (char)in_stack_fffffffffffffaac;
  rhs_01.SubFormat[0xd] = (char)((uint)in_stack_fffffffffffffaac >> 8);
  rhs_01.SubFormat[0xe] = (char)((uint)in_stack_fffffffffffffaac >> 0x10);
  rhs_01.SubFormat[0xf] = (char)((uint)in_stack_fffffffffffffaac >> 0x18);
  PrintExtensibleFmtChunk(rhs_01);
  memcpy(local_318,&local_10->BextChunk,0x270);
  puVar2 = local_318;
  puVar3 = &local_598;
  for (lVar1 = 0x4e; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  rhs_03.ckSize._0_4_ = uVar6;
  rhs_03.ckID[0] = (char)uVar5;
  rhs_03.ckID[1] = (char)((uint)uVar5 >> 8);
  rhs_03.ckID[2] = (char)((uint)uVar5 >> 0x10);
  rhs_03.ckID[3] = (char)((uint)uVar5 >> 0x18);
  rhs_03.ckSize._4_4_ = uVar7;
  rhs_03.Description[0] = (char)uVar8;
  rhs_03.Description[1] = (char)((uint)uVar8 >> 8);
  rhs_03.Description[2] = (char)((uint)uVar8 >> 0x10);
  rhs_03.Description[3] = (char)((uint)uVar8 >> 0x18);
  rhs_03.Description[4] = (char)uStack_90;
  rhs_03.Description[5] = (char)((ulong)uStack_90 >> 8);
  rhs_03.Description[6] = (char)((ulong)uStack_90 >> 0x10);
  rhs_03.Description[7] = (char)((ulong)uStack_90 >> 0x18);
  rhs_03.Description[8] = (char)((ulong)uStack_90 >> 0x20);
  rhs_03.Description[9] = (char)((ulong)uStack_90 >> 0x28);
  rhs_03.Description[10] = (char)((ulong)uStack_90 >> 0x30);
  rhs_03.Description[0xb] = (char)((ulong)uStack_90 >> 0x38);
  rhs_03.Description[0xc] = (char)local_88;
  rhs_03.Description[0xd] = (char)((ulong)local_88 >> 8);
  rhs_03.Description[0xe] = (char)((ulong)local_88 >> 0x10);
  rhs_03.Description[0xf] = (char)((ulong)local_88 >> 0x18);
  rhs_03.Description[0x10] = (char)((ulong)local_88 >> 0x20);
  rhs_03.Description[0x11] = (char)((ulong)local_88 >> 0x28);
  rhs_03.Description[0x12] = (char)((ulong)local_88 >> 0x30);
  rhs_03.Description[0x13] = (char)((ulong)local_88 >> 0x38);
  rhs_03.Description[0x14] = (char)uStack_80;
  rhs_03.Description[0x15] = (char)((ulong)uStack_80 >> 8);
  rhs_03.Description[0x16] = (char)((ulong)uStack_80 >> 0x10);
  rhs_03.Description[0x17] = (char)((ulong)uStack_80 >> 0x18);
  rhs_03.Description[0x18] = (char)((ulong)uStack_80 >> 0x20);
  rhs_03.Description[0x19] = (char)((ulong)uStack_80 >> 0x28);
  rhs_03.Description[0x1a] = (char)((ulong)uStack_80 >> 0x30);
  rhs_03.Description[0x1b] = (char)((ulong)uStack_80 >> 0x38);
  rhs_03.Description[0x1c] = (char)local_78;
  rhs_03.Description[0x1d] = (char)((ulong)local_78 >> 8);
  rhs_03.Description[0x1e] = (char)((ulong)local_78 >> 0x10);
  rhs_03.Description[0x1f] = (char)((ulong)local_78 >> 0x18);
  rhs_03.Description[0x20] = (char)((ulong)local_78 >> 0x20);
  rhs_03.Description[0x21] = (char)((ulong)local_78 >> 0x28);
  rhs_03.Description[0x22] = (char)((ulong)local_78 >> 0x30);
  rhs_03.Description[0x23] = (char)((ulong)local_78 >> 0x38);
  rhs_03.Description[0x24] = (char)uStack_70;
  rhs_03.Description[0x25] = (char)((ulong)uStack_70 >> 8);
  rhs_03.Description[0x26] = (char)((ulong)uStack_70 >> 0x10);
  rhs_03.Description[0x27] = (char)((ulong)uStack_70 >> 0x18);
  rhs_03.Description[0x28] = (char)((ulong)uStack_70 >> 0x20);
  rhs_03.Description[0x29] = (char)((ulong)uStack_70 >> 0x28);
  rhs_03.Description[0x2a] = (char)((ulong)uStack_70 >> 0x30);
  rhs_03.Description[0x2b] = (char)((ulong)uStack_70 >> 0x38);
  rhs_03.Description[0x2c] = (char)local_28;
  rhs_03.Description[0x2d] = (char)((uint)local_28 >> 8);
  rhs_03.Description[0x2e] = (char)((uint)local_28 >> 0x10);
  rhs_03.Description[0x2f] = (char)((uint)local_28 >> 0x18);
  rhs_03.Description[0x30] = (char)in_stack_fffffffffffffaac;
  rhs_03.Description[0x31] = (char)((uint)in_stack_fffffffffffffaac >> 8);
  rhs_03.Description[0x32] = (char)((uint)in_stack_fffffffffffffaac >> 0x10);
  rhs_03.Description[0x33] = (char)((uint)in_stack_fffffffffffffaac >> 0x18);
  rhs_03.Description[0x34] = (char)in_stack_fffffffffffffab0;
  rhs_03.Description[0x35] = (char)((uint)in_stack_fffffffffffffab0 >> 8);
  rhs_03.Description[0x36] = (char)((uint)in_stack_fffffffffffffab0 >> 0x10);
  rhs_03.Description[0x37] = (char)((uint)in_stack_fffffffffffffab0 >> 0x18);
  rhs_03.Description[0x38] = in_stack_fffffffffffffab4[0];
  rhs_03.Description[0x39] = in_stack_fffffffffffffab4[1];
  rhs_03.Description[0x3a] = in_stack_fffffffffffffab4[2];
  rhs_03.Description[0x3b] = in_stack_fffffffffffffab4[3];
  rhs_03.Description[0x3c] = in_stack_fffffffffffffab4[4];
  rhs_03.Description[0x3d] = in_stack_fffffffffffffab4[5];
  rhs_03.Description[0x3e] = in_stack_fffffffffffffab4[6];
  rhs_03.Description[0x3f] = in_stack_fffffffffffffab4[7];
  rhs_03.Description[0x40] = in_stack_fffffffffffffab4[8];
  rhs_03.Description[0x41] = in_stack_fffffffffffffab4[9];
  rhs_03.Description[0x42] = in_stack_fffffffffffffab4[10];
  rhs_03.Description[0x43] = in_stack_fffffffffffffab4[0xb];
  rhs_03.Description[0x44] = in_stack_fffffffffffffab4[0xc];
  rhs_03.Description[0x45] = in_stack_fffffffffffffab4[0xd];
  rhs_03.Description[0x46] = in_stack_fffffffffffffab4[0xe];
  rhs_03.Description[0x47] = in_stack_fffffffffffffab4[0xf];
  rhs_03.Description[0x48] = in_stack_fffffffffffffab4[0x10];
  rhs_03.Description[0x49] = in_stack_fffffffffffffab4[0x11];
  rhs_03.Description[0x4a] = in_stack_fffffffffffffab4[0x12];
  rhs_03.Description[0x4b] = in_stack_fffffffffffffab4[0x13];
  rhs_03.Description[0x4c] = in_stack_fffffffffffffab4[0x14];
  rhs_03.Description[0x4d] = in_stack_fffffffffffffab4[0x15];
  rhs_03.Description[0x4e] = in_stack_fffffffffffffab4[0x16];
  rhs_03.Description[0x4f] = in_stack_fffffffffffffab4[0x17];
  rhs_03.Description[0x50] = in_stack_fffffffffffffab4[0x18];
  rhs_03.Description[0x51] = in_stack_fffffffffffffab4[0x19];
  rhs_03.Description[0x52] = in_stack_fffffffffffffab4[0x1a];
  rhs_03.Description[0x53] = in_stack_fffffffffffffab4[0x1b];
  rhs_03.Description[0x54] = in_stack_fffffffffffffab4[0x1c];
  rhs_03.Description[0x55] = in_stack_fffffffffffffab4[0x1d];
  rhs_03.Description[0x56] = in_stack_fffffffffffffab4[0x1e];
  rhs_03.Description[0x57] = in_stack_fffffffffffffab4[0x1f];
  rhs_03.Description[0x58] = in_stack_fffffffffffffab4[0x20];
  rhs_03.Description[0x59] = in_stack_fffffffffffffab4[0x21];
  rhs_03.Description[0x5a] = in_stack_fffffffffffffab4[0x22];
  rhs_03.Description[0x5b] = in_stack_fffffffffffffab4[0x23];
  rhs_03.Description[0x5c] = in_stack_fffffffffffffab4[0x24];
  rhs_03.Description[0x5d] = in_stack_fffffffffffffab4[0x25];
  rhs_03.Description[0x5e] = in_stack_fffffffffffffab4[0x26];
  rhs_03.Description[0x5f] = in_stack_fffffffffffffab4[0x27];
  rhs_03.Description[0x60] = in_stack_fffffffffffffab4[0x28];
  rhs_03.Description[0x61] = in_stack_fffffffffffffab4[0x29];
  rhs_03.Description[0x62] = in_stack_fffffffffffffab4[0x2a];
  rhs_03.Description[99] = in_stack_fffffffffffffab4[0x2b];
  rhs_03.Description[100] = in_stack_fffffffffffffab4[0x2c];
  rhs_03.Description[0x65] = in_stack_fffffffffffffab4[0x2d];
  rhs_03.Description[0x66] = in_stack_fffffffffffffab4[0x2e];
  rhs_03.Description[0x67] = in_stack_fffffffffffffab4[0x2f];
  rhs_03.Description[0x68] = in_stack_fffffffffffffab4[0x30];
  rhs_03.Description[0x69] = in_stack_fffffffffffffab4[0x31];
  rhs_03.Description[0x6a] = in_stack_fffffffffffffab4[0x32];
  rhs_03.Description[0x6b] = in_stack_fffffffffffffab4[0x33];
  rhs_03.Description[0x6c] = in_stack_fffffffffffffab4[0x34];
  rhs_03.Description[0x6d] = in_stack_fffffffffffffab4[0x35];
  rhs_03.Description[0x6e] = in_stack_fffffffffffffab4[0x36];
  rhs_03.Description[0x6f] = in_stack_fffffffffffffab4[0x37];
  rhs_03.Description[0x70] = in_stack_fffffffffffffab4[0x38];
  rhs_03.Description[0x71] = in_stack_fffffffffffffab4[0x39];
  rhs_03.Description[0x72] = in_stack_fffffffffffffab4[0x3a];
  rhs_03.Description[0x73] = in_stack_fffffffffffffab4[0x3b];
  rhs_03.Description[0x74] = in_stack_fffffffffffffab4[0x3c];
  rhs_03.Description[0x75] = in_stack_fffffffffffffab4[0x3d];
  rhs_03.Description[0x76] = in_stack_fffffffffffffab4[0x3e];
  rhs_03.Description[0x77] = in_stack_fffffffffffffab4[0x3f];
  rhs_03.Description[0x78] = in_stack_fffffffffffffab4[0x40];
  rhs_03.Description[0x79] = in_stack_fffffffffffffab4[0x41];
  rhs_03.Description[0x7a] = in_stack_fffffffffffffab4[0x42];
  rhs_03.Description[0x7b] = in_stack_fffffffffffffab4[0x43];
  rhs_03.Description[0x7c] = in_stack_fffffffffffffab4[0x44];
  rhs_03.Description[0x7d] = in_stack_fffffffffffffab4[0x45];
  rhs_03.Description[0x7e] = in_stack_fffffffffffffab4[0x46];
  rhs_03.Description[0x7f] = in_stack_fffffffffffffab4[0x47];
  rhs_03.Description[0x80] = in_stack_fffffffffffffab4[0x48];
  rhs_03.Description[0x81] = in_stack_fffffffffffffab4[0x49];
  rhs_03.Description[0x82] = in_stack_fffffffffffffab4[0x4a];
  rhs_03.Description[0x83] = in_stack_fffffffffffffab4[0x4b];
  rhs_03.Description[0x84] = in_stack_fffffffffffffab4[0x4c];
  rhs_03.Description[0x85] = in_stack_fffffffffffffab4[0x4d];
  rhs_03.Description[0x86] = in_stack_fffffffffffffab4[0x4e];
  rhs_03.Description[0x87] = in_stack_fffffffffffffab4[0x4f];
  rhs_03.Description[0x88] = in_stack_fffffffffffffab4[0x50];
  rhs_03.Description[0x89] = in_stack_fffffffffffffab4[0x51];
  rhs_03.Description[0x8a] = in_stack_fffffffffffffab4[0x52];
  rhs_03.Description[0x8b] = in_stack_fffffffffffffab4[0x53];
  rhs_03.Description[0x8c] = in_stack_fffffffffffffab4[0x54];
  rhs_03.Description[0x8d] = in_stack_fffffffffffffab4[0x55];
  rhs_03.Description[0x8e] = in_stack_fffffffffffffab4[0x56];
  rhs_03.Description[0x8f] = in_stack_fffffffffffffab4[0x57];
  rhs_03.Description[0x90] = in_stack_fffffffffffffab4[0x58];
  rhs_03.Description[0x91] = in_stack_fffffffffffffab4[0x59];
  rhs_03.Description[0x92] = in_stack_fffffffffffffab4[0x5a];
  rhs_03.Description[0x93] = in_stack_fffffffffffffab4[0x5b];
  rhs_03.Description[0x94] = in_stack_fffffffffffffab4[0x5c];
  rhs_03.Description[0x95] = in_stack_fffffffffffffab4[0x5d];
  rhs_03.Description[0x96] = in_stack_fffffffffffffab4[0x5e];
  rhs_03.Description[0x97] = in_stack_fffffffffffffab4[0x5f];
  rhs_03.Description[0x98] = in_stack_fffffffffffffab4[0x60];
  rhs_03.Description[0x99] = in_stack_fffffffffffffab4[0x61];
  rhs_03.Description[0x9a] = in_stack_fffffffffffffab4[0x62];
  rhs_03.Description[0x9b] = in_stack_fffffffffffffab4[99];
  rhs_03.Description[0x9c] = in_stack_fffffffffffffab4[100];
  rhs_03.Description[0x9d] = in_stack_fffffffffffffab4[0x65];
  rhs_03.Description[0x9e] = in_stack_fffffffffffffab4[0x66];
  rhs_03.Description[0x9f] = in_stack_fffffffffffffab4[0x67];
  rhs_03.Description[0xa0] = in_stack_fffffffffffffab4[0x68];
  rhs_03.Description[0xa1] = in_stack_fffffffffffffab4[0x69];
  rhs_03.Description[0xa2] = in_stack_fffffffffffffab4[0x6a];
  rhs_03.Description[0xa3] = in_stack_fffffffffffffab4[0x6b];
  rhs_03.Description[0xa4] = in_stack_fffffffffffffab4[0x6c];
  rhs_03.Description[0xa5] = in_stack_fffffffffffffab4[0x6d];
  rhs_03.Description[0xa6] = in_stack_fffffffffffffab4[0x6e];
  rhs_03.Description[0xa7] = in_stack_fffffffffffffab4[0x6f];
  rhs_03.Description[0xa8] = in_stack_fffffffffffffab4[0x70];
  rhs_03.Description[0xa9] = in_stack_fffffffffffffab4[0x71];
  rhs_03.Description[0xaa] = in_stack_fffffffffffffab4[0x72];
  rhs_03.Description[0xab] = in_stack_fffffffffffffab4[0x73];
  rhs_03.Description[0xac] = in_stack_fffffffffffffab4[0x74];
  rhs_03.Description[0xad] = in_stack_fffffffffffffab4[0x75];
  rhs_03.Description[0xae] = in_stack_fffffffffffffab4[0x76];
  rhs_03.Description[0xaf] = in_stack_fffffffffffffab4[0x77];
  rhs_03.Description[0xb0] = in_stack_fffffffffffffab4[0x78];
  rhs_03.Description[0xb1] = in_stack_fffffffffffffab4[0x79];
  rhs_03.Description[0xb2] = in_stack_fffffffffffffab4[0x7a];
  rhs_03.Description[0xb3] = in_stack_fffffffffffffab4[0x7b];
  rhs_03.Description[0xb4] = in_stack_fffffffffffffab4[0x7c];
  rhs_03.Description[0xb5] = in_stack_fffffffffffffab4[0x7d];
  rhs_03.Description[0xb6] = in_stack_fffffffffffffab4[0x7e];
  rhs_03.Description[0xb7] = in_stack_fffffffffffffab4[0x7f];
  rhs_03.Description[0xb8] = in_stack_fffffffffffffab4[0x80];
  rhs_03.Description[0xb9] = in_stack_fffffffffffffab4[0x81];
  rhs_03.Description[0xba] = in_stack_fffffffffffffab4[0x82];
  rhs_03.Description[0xbb] = in_stack_fffffffffffffab4[0x83];
  rhs_03.Description[0xbc] = in_stack_fffffffffffffab4[0x84];
  rhs_03.Description[0xbd] = in_stack_fffffffffffffab4[0x85];
  rhs_03.Description[0xbe] = in_stack_fffffffffffffab4[0x86];
  rhs_03.Description[0xbf] = in_stack_fffffffffffffab4[0x87];
  rhs_03.Description[0xc0] = in_stack_fffffffffffffab4[0x88];
  rhs_03.Description[0xc1] = in_stack_fffffffffffffab4[0x89];
  rhs_03.Description[0xc2] = in_stack_fffffffffffffab4[0x8a];
  rhs_03.Description[0xc3] = in_stack_fffffffffffffab4[0x8b];
  rhs_03.Description[0xc4] = in_stack_fffffffffffffab4[0x8c];
  rhs_03.Description[0xc5] = in_stack_fffffffffffffab4[0x8d];
  rhs_03.Description[0xc6] = in_stack_fffffffffffffab4[0x8e];
  rhs_03.Description[199] = in_stack_fffffffffffffab4[0x8f];
  rhs_03.Description[200] = in_stack_fffffffffffffab4[0x90];
  rhs_03.Description[0xc9] = in_stack_fffffffffffffab4[0x91];
  rhs_03.Description[0xca] = in_stack_fffffffffffffab4[0x92];
  rhs_03.Description[0xcb] = in_stack_fffffffffffffab4[0x93];
  rhs_03.Description[0xcc] = in_stack_fffffffffffffab4[0x94];
  rhs_03.Description[0xcd] = in_stack_fffffffffffffab4[0x95];
  rhs_03.Description[0xce] = in_stack_fffffffffffffab4[0x96];
  rhs_03.Description[0xcf] = in_stack_fffffffffffffab4[0x97];
  rhs_03.Description[0xd0] = in_stack_fffffffffffffab4[0x98];
  rhs_03.Description[0xd1] = in_stack_fffffffffffffab4[0x99];
  rhs_03.Description[0xd2] = in_stack_fffffffffffffab4[0x9a];
  rhs_03.Description[0xd3] = in_stack_fffffffffffffab4[0x9b];
  rhs_03.Description[0xd4] = in_stack_fffffffffffffab4[0x9c];
  rhs_03.Description[0xd5] = in_stack_fffffffffffffab4[0x9d];
  rhs_03.Description[0xd6] = in_stack_fffffffffffffab4[0x9e];
  rhs_03.Description[0xd7] = in_stack_fffffffffffffab4[0x9f];
  rhs_03.Description[0xd8] = in_stack_fffffffffffffab4[0xa0];
  rhs_03.Description[0xd9] = in_stack_fffffffffffffab4[0xa1];
  rhs_03.Description[0xda] = in_stack_fffffffffffffab4[0xa2];
  rhs_03.Description[0xdb] = in_stack_fffffffffffffab4[0xa3];
  rhs_03.Description[0xdc] = in_stack_fffffffffffffab4[0xa4];
  rhs_03.Description[0xdd] = in_stack_fffffffffffffab4[0xa5];
  rhs_03.Description[0xde] = in_stack_fffffffffffffab4[0xa6];
  rhs_03.Description[0xdf] = in_stack_fffffffffffffab4[0xa7];
  rhs_03.Description[0xe0] = in_stack_fffffffffffffab4[0xa8];
  rhs_03.Description[0xe1] = in_stack_fffffffffffffab4[0xa9];
  rhs_03.Description[0xe2] = in_stack_fffffffffffffab4[0xaa];
  rhs_03.Description[0xe3] = in_stack_fffffffffffffab4[0xab];
  rhs_03.Description[0xe4] = in_stack_fffffffffffffab4[0xac];
  rhs_03.Description[0xe5] = in_stack_fffffffffffffab4[0xad];
  rhs_03.Description[0xe6] = in_stack_fffffffffffffab4[0xae];
  rhs_03.Description[0xe7] = in_stack_fffffffffffffab4[0xaf];
  rhs_03.Description[0xe8] = in_stack_fffffffffffffab4[0xb0];
  rhs_03.Description[0xe9] = in_stack_fffffffffffffab4[0xb1];
  rhs_03.Description[0xea] = in_stack_fffffffffffffab4[0xb2];
  rhs_03.Description[0xeb] = in_stack_fffffffffffffab4[0xb3];
  rhs_03.Description[0xec] = in_stack_fffffffffffffab4[0xb4];
  rhs_03.Description[0xed] = in_stack_fffffffffffffab4[0xb5];
  rhs_03.Description[0xee] = in_stack_fffffffffffffab4[0xb6];
  rhs_03.Description[0xef] = in_stack_fffffffffffffab4[0xb7];
  rhs_03.Description[0xf0] = in_stack_fffffffffffffab4[0xb8];
  rhs_03.Description[0xf1] = in_stack_fffffffffffffab4[0xb9];
  rhs_03.Description[0xf2] = in_stack_fffffffffffffab4[0xba];
  rhs_03.Description[0xf3] = in_stack_fffffffffffffab4[0xbb];
  rhs_03.Description[0xf4] = in_stack_fffffffffffffab4[0xbc];
  rhs_03.Description[0xf5] = in_stack_fffffffffffffab4[0xbd];
  rhs_03.Description[0xf6] = in_stack_fffffffffffffab4[0xbe];
  rhs_03.Description[0xf7] = in_stack_fffffffffffffab4[0xbf];
  rhs_03.Description[0xf8] = in_stack_fffffffffffffab4[0xc0];
  rhs_03.Description[0xf9] = in_stack_fffffffffffffab4[0xc1];
  rhs_03.Description[0xfa] = in_stack_fffffffffffffab4[0xc2];
  rhs_03.Description[0xfb] = in_stack_fffffffffffffab4[0xc3];
  rhs_03.Description[0xfc] = in_stack_fffffffffffffab4[0xc4];
  rhs_03.Description[0xfd] = in_stack_fffffffffffffab4[0xc5];
  rhs_03.Description[0xfe] = in_stack_fffffffffffffab4[0xc6];
  rhs_03.Description[0xff] = in_stack_fffffffffffffab4[199];
  rhs_03.Originator[0] = in_stack_fffffffffffffab4[200];
  rhs_03.Originator[1] = in_stack_fffffffffffffab4[0xc9];
  rhs_03.Originator[2] = in_stack_fffffffffffffab4[0xca];
  rhs_03.Originator[3] = in_stack_fffffffffffffab4[0xcb];
  rhs_03.Originator[4] = in_stack_fffffffffffffab4[0xcc];
  rhs_03.Originator[5] = in_stack_fffffffffffffab4[0xcd];
  rhs_03.Originator[6] = in_stack_fffffffffffffab4[0xce];
  rhs_03.Originator[7] = in_stack_fffffffffffffab4[0xcf];
  rhs_03.Originator[8] = in_stack_fffffffffffffab4[0xd0];
  rhs_03.Originator[9] = in_stack_fffffffffffffab4[0xd1];
  rhs_03.Originator[10] = in_stack_fffffffffffffab4[0xd2];
  rhs_03.Originator[0xb] = in_stack_fffffffffffffab4[0xd3];
  rhs_03.Originator[0xc] = in_stack_fffffffffffffab4[0xd4];
  rhs_03.Originator[0xd] = in_stack_fffffffffffffab4[0xd5];
  rhs_03.Originator[0xe] = in_stack_fffffffffffffab4[0xd6];
  rhs_03.Originator[0xf] = in_stack_fffffffffffffab4[0xd7];
  rhs_03.Originator[0x10] = in_stack_fffffffffffffab4[0xd8];
  rhs_03.Originator[0x11] = in_stack_fffffffffffffab4[0xd9];
  rhs_03.Originator[0x12] = in_stack_fffffffffffffab4[0xda];
  rhs_03.Originator[0x13] = in_stack_fffffffffffffab4[0xdb];
  rhs_03.Originator[0x14] = in_stack_fffffffffffffab4[0xdc];
  rhs_03.Originator[0x15] = in_stack_fffffffffffffab4[0xdd];
  rhs_03.Originator[0x16] = in_stack_fffffffffffffab4[0xde];
  rhs_03.Originator[0x17] = in_stack_fffffffffffffab4[0xdf];
  rhs_03.Originator[0x18] = in_stack_fffffffffffffab4[0xe0];
  rhs_03.Originator[0x19] = in_stack_fffffffffffffab4[0xe1];
  rhs_03.Originator[0x1a] = in_stack_fffffffffffffab4[0xe2];
  rhs_03.Originator[0x1b] = in_stack_fffffffffffffab4[0xe3];
  rhs_03.Originator[0x1c] = in_stack_fffffffffffffab4[0xe4];
  rhs_03.Originator[0x1d] = in_stack_fffffffffffffab4[0xe5];
  rhs_03.Originator[0x1e] = in_stack_fffffffffffffab4[0xe6];
  rhs_03.Originator[0x1f] = in_stack_fffffffffffffab4[0xe7];
  rhs_03.OriginatorReference[0] = in_stack_fffffffffffffab4[0xe8];
  rhs_03.OriginatorReference[1] = in_stack_fffffffffffffab4[0xe9];
  rhs_03.OriginatorReference[2] = in_stack_fffffffffffffab4[0xea];
  rhs_03.OriginatorReference[3] = in_stack_fffffffffffffab4[0xeb];
  rhs_03.OriginatorReference[4] = in_stack_fffffffffffffab4[0xec];
  rhs_03.OriginatorReference[5] = in_stack_fffffffffffffab4[0xed];
  rhs_03.OriginatorReference[6] = in_stack_fffffffffffffab4[0xee];
  rhs_03.OriginatorReference[7] = in_stack_fffffffffffffab4[0xef];
  rhs_03.OriginatorReference[8] = in_stack_fffffffffffffab4[0xf0];
  rhs_03.OriginatorReference[9] = in_stack_fffffffffffffab4[0xf1];
  rhs_03.OriginatorReference[10] = in_stack_fffffffffffffab4[0xf2];
  rhs_03.OriginatorReference[0xb] = in_stack_fffffffffffffab4[0xf3];
  rhs_03.OriginatorReference[0xc] = in_stack_fffffffffffffab4[0xf4];
  rhs_03.OriginatorReference[0xd] = in_stack_fffffffffffffab4[0xf5];
  rhs_03.OriginatorReference[0xe] = in_stack_fffffffffffffab4[0xf6];
  rhs_03.OriginatorReference[0xf] = in_stack_fffffffffffffab4[0xf7];
  rhs_03.OriginatorReference[0x10] = in_stack_fffffffffffffab4[0xf8];
  rhs_03.OriginatorReference[0x11] = in_stack_fffffffffffffab4[0xf9];
  rhs_03.OriginatorReference[0x12] = in_stack_fffffffffffffab4[0xfa];
  rhs_03.OriginatorReference[0x13] = in_stack_fffffffffffffab4[0xfb];
  rhs_03.OriginatorReference[0x14] = in_stack_fffffffffffffab4[0xfc];
  rhs_03.OriginatorReference[0x15] = in_stack_fffffffffffffab4[0xfd];
  rhs_03.OriginatorReference[0x16] = in_stack_fffffffffffffab4[0xfe];
  rhs_03.OriginatorReference[0x17] = in_stack_fffffffffffffab4[0xff];
  rhs_03.OriginatorReference[0x18] = in_stack_fffffffffffffab4[0x100];
  rhs_03.OriginatorReference[0x19] = in_stack_fffffffffffffab4[0x101];
  rhs_03.OriginatorReference[0x1a] = in_stack_fffffffffffffab4[0x102];
  rhs_03.OriginatorReference[0x1b] = in_stack_fffffffffffffab4[0x103];
  rhs_03.OriginatorReference[0x1c] = in_stack_fffffffffffffab4[0x104];
  rhs_03.OriginatorReference[0x1d] = in_stack_fffffffffffffab4[0x105];
  rhs_03.OriginatorReference[0x1e] = in_stack_fffffffffffffab4[0x106];
  rhs_03.OriginatorReference[0x1f] = in_stack_fffffffffffffab4[0x107];
  rhs_03.OriginationDate[0] = in_stack_fffffffffffffab4[0x108];
  rhs_03.OriginationDate[1] = in_stack_fffffffffffffab4[0x109];
  rhs_03.OriginationDate[2] = in_stack_fffffffffffffab4[0x10a];
  rhs_03.OriginationDate[3] = in_stack_fffffffffffffab4[0x10b];
  rhs_03.OriginationDate[4] = in_stack_fffffffffffffab4[0x10c];
  rhs_03.OriginationDate[5] = in_stack_fffffffffffffab4[0x10d];
  rhs_03.OriginationDate[6] = in_stack_fffffffffffffab4[0x10e];
  rhs_03.OriginationDate[7] = in_stack_fffffffffffffab4[0x10f];
  rhs_03.OriginationDate[8] = in_stack_fffffffffffffab4[0x110];
  rhs_03.OriginationDate[9] = in_stack_fffffffffffffab4[0x111];
  rhs_03.OriginationTime[0] = in_stack_fffffffffffffab4[0x112];
  rhs_03.OriginationTime[1] = in_stack_fffffffffffffab4[0x113];
  rhs_03.OriginationTime[2] = in_stack_fffffffffffffab4[0x114];
  rhs_03.OriginationTime[3] = in_stack_fffffffffffffab4[0x115];
  rhs_03.OriginationTime[4] = in_stack_fffffffffffffab4[0x116];
  rhs_03.OriginationTime[5] = in_stack_fffffffffffffab4[0x117];
  rhs_03.OriginationTime[6] = in_stack_fffffffffffffab4[0x118];
  rhs_03.OriginationTime[7] = in_stack_fffffffffffffab4[0x119];
  rhs_03.Align = in_stack_fffffffffffffab4._282_2_;
  rhs_03.TimeReferenceLow = in_stack_fffffffffffffab4._284_8_;
  rhs_03.TimeReferenceHigh = in_stack_fffffffffffffab4._292_8_;
  rhs_03.Version = in_stack_fffffffffffffab4._300_2_;
  rhs_03.UMID[0] = in_stack_fffffffffffffab4[0x12e];
  rhs_03.UMID[1] = in_stack_fffffffffffffab4[0x12f];
  rhs_03.UMID[2] = in_stack_fffffffffffffab4[0x130];
  rhs_03.UMID[3] = in_stack_fffffffffffffab4[0x131];
  rhs_03.UMID[4] = in_stack_fffffffffffffab4[0x132];
  rhs_03.UMID[5] = in_stack_fffffffffffffab4[0x133];
  rhs_03.UMID[6] = in_stack_fffffffffffffab4[0x134];
  rhs_03.UMID[7] = in_stack_fffffffffffffab4[0x135];
  rhs_03.UMID[8] = in_stack_fffffffffffffab4[0x136];
  rhs_03.UMID[9] = in_stack_fffffffffffffab4[0x137];
  rhs_03.UMID[10] = in_stack_fffffffffffffab4[0x138];
  rhs_03.UMID[0xb] = in_stack_fffffffffffffab4[0x139];
  rhs_03.UMID[0xc] = in_stack_fffffffffffffab4[0x13a];
  rhs_03.UMID[0xd] = in_stack_fffffffffffffab4[0x13b];
  rhs_03.UMID[0xe] = in_stack_fffffffffffffab4[0x13c];
  rhs_03.UMID[0xf] = in_stack_fffffffffffffab4[0x13d];
  rhs_03.UMID[0x10] = in_stack_fffffffffffffab4[0x13e];
  rhs_03.UMID[0x11] = in_stack_fffffffffffffab4[0x13f];
  rhs_03.UMID[0x12] = in_stack_fffffffffffffab4[0x140];
  rhs_03.UMID[0x13] = in_stack_fffffffffffffab4[0x141];
  rhs_03.UMID[0x14] = in_stack_fffffffffffffab4[0x142];
  rhs_03.UMID[0x15] = in_stack_fffffffffffffab4[0x143];
  rhs_03.UMID[0x16] = in_stack_fffffffffffffab4[0x144];
  rhs_03.UMID[0x17] = in_stack_fffffffffffffab4[0x145];
  rhs_03.UMID[0x18] = in_stack_fffffffffffffab4[0x146];
  rhs_03.UMID[0x19] = in_stack_fffffffffffffab4[0x147];
  rhs_03.UMID[0x1a] = in_stack_fffffffffffffab4[0x148];
  rhs_03.UMID[0x1b] = in_stack_fffffffffffffab4[0x149];
  rhs_03.UMID[0x1c] = in_stack_fffffffffffffab4[0x14a];
  rhs_03.UMID[0x1d] = in_stack_fffffffffffffab4[0x14b];
  rhs_03.UMID[0x1e] = in_stack_fffffffffffffab4[0x14c];
  rhs_03.UMID[0x1f] = in_stack_fffffffffffffab4[0x14d];
  rhs_03.UMID[0x20] = in_stack_fffffffffffffab4[0x14e];
  rhs_03.UMID[0x21] = in_stack_fffffffffffffab4[0x14f];
  rhs_03.UMID[0x22] = in_stack_fffffffffffffab4[0x150];
  rhs_03.UMID[0x23] = in_stack_fffffffffffffab4[0x151];
  rhs_03.UMID[0x24] = in_stack_fffffffffffffab4[0x152];
  rhs_03.UMID[0x25] = in_stack_fffffffffffffab4[0x153];
  rhs_03.UMID[0x26] = in_stack_fffffffffffffab4[0x154];
  rhs_03.UMID[0x27] = in_stack_fffffffffffffab4[0x155];
  rhs_03.UMID[0x28] = in_stack_fffffffffffffab4[0x156];
  rhs_03.UMID[0x29] = in_stack_fffffffffffffab4[0x157];
  rhs_03.UMID[0x2a] = in_stack_fffffffffffffab4[0x158];
  rhs_03.UMID[0x2b] = in_stack_fffffffffffffab4[0x159];
  rhs_03.UMID[0x2c] = in_stack_fffffffffffffab4[0x15a];
  rhs_03.UMID[0x2d] = in_stack_fffffffffffffab4[0x15b];
  rhs_03.UMID[0x2e] = in_stack_fffffffffffffab4[0x15c];
  rhs_03.UMID[0x2f] = in_stack_fffffffffffffab4[0x15d];
  rhs_03.UMID[0x30] = in_stack_fffffffffffffab4[0x15e];
  rhs_03.UMID[0x31] = in_stack_fffffffffffffab4[0x15f];
  rhs_03.UMID[0x32] = in_stack_fffffffffffffab4[0x160];
  rhs_03.UMID[0x33] = in_stack_fffffffffffffab4[0x161];
  rhs_03.UMID[0x34] = in_stack_fffffffffffffab4[0x162];
  rhs_03.UMID[0x35] = in_stack_fffffffffffffab4[0x163];
  rhs_03.UMID[0x36] = in_stack_fffffffffffffab4[0x164];
  rhs_03.UMID[0x37] = in_stack_fffffffffffffab4[0x165];
  rhs_03.UMID[0x38] = in_stack_fffffffffffffab4[0x166];
  rhs_03.UMID[0x39] = in_stack_fffffffffffffab4[0x167];
  rhs_03.UMID[0x3a] = in_stack_fffffffffffffab4[0x168];
  rhs_03.UMID[0x3b] = in_stack_fffffffffffffab4[0x169];
  rhs_03.UMID[0x3c] = in_stack_fffffffffffffab4[0x16a];
  rhs_03.UMID[0x3d] = in_stack_fffffffffffffab4[0x16b];
  rhs_03.UMID[0x3e] = in_stack_fffffffffffffab4[0x16c];
  rhs_03.UMID[0x3f] = in_stack_fffffffffffffab4[0x16d];
  rhs_03.LoudnessValue = in_stack_fffffffffffffab4._366_2_;
  rhs_03.LoudnessRange = in_stack_fffffffffffffab4._368_2_;
  rhs_03.MaxTruePeakLevel = in_stack_fffffffffffffab4._370_2_;
  rhs_03.MaxMomentaryLoudness = in_stack_fffffffffffffab4._372_2_;
  rhs_03.MaxShortTermLoudness = in_stack_fffffffffffffab4._374_2_;
  rhs_03.Reserved[0] = in_stack_fffffffffffffab4[0x178];
  rhs_03.Reserved[1] = in_stack_fffffffffffffab4[0x179];
  rhs_03.Reserved[2] = in_stack_fffffffffffffab4[0x17a];
  rhs_03.Reserved[3] = in_stack_fffffffffffffab4[0x17b];
  rhs_03.Reserved[4] = in_stack_fffffffffffffab4[0x17c];
  rhs_03.Reserved[5] = in_stack_fffffffffffffab4[0x17d];
  rhs_03.Reserved[6] = in_stack_fffffffffffffab4[0x17e];
  rhs_03.Reserved[7] = in_stack_fffffffffffffab4[0x17f];
  rhs_03.Reserved[8] = in_stack_fffffffffffffab4[0x180];
  rhs_03.Reserved[9] = in_stack_fffffffffffffab4[0x181];
  rhs_03.Reserved[10] = in_stack_fffffffffffffab4[0x182];
  rhs_03.Reserved[0xb] = in_stack_fffffffffffffab4[0x183];
  rhs_03.Reserved[0xc] = in_stack_fffffffffffffab4[0x184];
  rhs_03.Reserved[0xd] = in_stack_fffffffffffffab4[0x185];
  rhs_03.Reserved[0xe] = in_stack_fffffffffffffab4[0x186];
  rhs_03.Reserved[0xf] = in_stack_fffffffffffffab4[0x187];
  rhs_03.Reserved[0x10] = in_stack_fffffffffffffab4[0x188];
  rhs_03.Reserved[0x11] = in_stack_fffffffffffffab4[0x189];
  rhs_03.Reserved[0x12] = in_stack_fffffffffffffab4[0x18a];
  rhs_03.Reserved[0x13] = in_stack_fffffffffffffab4[0x18b];
  rhs_03.Reserved[0x14] = in_stack_fffffffffffffab4[0x18c];
  rhs_03.Reserved[0x15] = in_stack_fffffffffffffab4[0x18d];
  rhs_03.Reserved[0x16] = in_stack_fffffffffffffab4[0x18e];
  rhs_03.Reserved[0x17] = in_stack_fffffffffffffab4[399];
  rhs_03.Reserved[0x18] = in_stack_fffffffffffffab4[400];
  rhs_03.Reserved[0x19] = in_stack_fffffffffffffab4[0x191];
  rhs_03.Reserved[0x1a] = in_stack_fffffffffffffab4[0x192];
  rhs_03.Reserved[0x1b] = in_stack_fffffffffffffab4[0x193];
  rhs_03.Reserved[0x1c] = in_stack_fffffffffffffab4[0x194];
  rhs_03.Reserved[0x1d] = in_stack_fffffffffffffab4[0x195];
  rhs_03.Reserved[0x1e] = in_stack_fffffffffffffab4[0x196];
  rhs_03.Reserved[0x1f] = in_stack_fffffffffffffab4[0x197];
  rhs_03.Reserved[0x20] = in_stack_fffffffffffffab4[0x198];
  rhs_03.Reserved[0x21] = in_stack_fffffffffffffab4[0x199];
  rhs_03.Reserved[0x22] = in_stack_fffffffffffffab4[0x19a];
  rhs_03.Reserved[0x23] = in_stack_fffffffffffffab4[0x19b];
  rhs_03.Reserved[0x24] = in_stack_fffffffffffffab4[0x19c];
  rhs_03.Reserved[0x25] = in_stack_fffffffffffffab4[0x19d];
  rhs_03.Reserved[0x26] = in_stack_fffffffffffffab4[0x19e];
  rhs_03.Reserved[0x27] = in_stack_fffffffffffffab4[0x19f];
  rhs_03.Reserved[0x28] = in_stack_fffffffffffffab4[0x1a0];
  rhs_03.Reserved[0x29] = in_stack_fffffffffffffab4[0x1a1];
  rhs_03.Reserved[0x2a] = in_stack_fffffffffffffab4[0x1a2];
  rhs_03.Reserved[0x2b] = in_stack_fffffffffffffab4[0x1a3];
  rhs_03.Reserved[0x2c] = in_stack_fffffffffffffab4[0x1a4];
  rhs_03.Reserved[0x2d] = in_stack_fffffffffffffab4[0x1a5];
  rhs_03.Reserved[0x2e] = in_stack_fffffffffffffab4[0x1a6];
  rhs_03.Reserved[0x2f] = in_stack_fffffffffffffab4[0x1a7];
  rhs_03.Reserved[0x30] = in_stack_fffffffffffffab4[0x1a8];
  rhs_03.Reserved[0x31] = in_stack_fffffffffffffab4[0x1a9];
  rhs_03.Reserved[0x32] = in_stack_fffffffffffffab4[0x1aa];
  rhs_03.Reserved[0x33] = in_stack_fffffffffffffab4[0x1ab];
  rhs_03.Reserved[0x34] = in_stack_fffffffffffffab4[0x1ac];
  rhs_03.Reserved[0x35] = in_stack_fffffffffffffab4[0x1ad];
  rhs_03.Reserved[0x36] = in_stack_fffffffffffffab4[0x1ae];
  rhs_03.Reserved[0x37] = in_stack_fffffffffffffab4[0x1af];
  rhs_03.Reserved[0x38] = in_stack_fffffffffffffab4[0x1b0];
  rhs_03.Reserved[0x39] = in_stack_fffffffffffffab4[0x1b1];
  rhs_03.Reserved[0x3a] = in_stack_fffffffffffffab4[0x1b2];
  rhs_03.Reserved[0x3b] = in_stack_fffffffffffffab4[0x1b3];
  rhs_03.Reserved[0x3c] = in_stack_fffffffffffffab4[0x1b4];
  rhs_03.Reserved[0x3d] = in_stack_fffffffffffffab4[0x1b5];
  rhs_03.Reserved[0x3e] = in_stack_fffffffffffffab4[0x1b6];
  rhs_03.Reserved[0x3f] = in_stack_fffffffffffffab4[0x1b7];
  rhs_03.Reserved[0x40] = in_stack_fffffffffffffab4[0x1b8];
  rhs_03.Reserved[0x41] = in_stack_fffffffffffffab4[0x1b9];
  rhs_03.Reserved[0x42] = in_stack_fffffffffffffab4[0x1ba];
  rhs_03.Reserved[0x43] = in_stack_fffffffffffffab4[0x1bb];
  rhs_03.Reserved[0x44] = in_stack_fffffffffffffab4[0x1bc];
  rhs_03.Reserved[0x45] = in_stack_fffffffffffffab4[0x1bd];
  rhs_03.Reserved[0x46] = in_stack_fffffffffffffab4[0x1be];
  rhs_03.Reserved[0x47] = in_stack_fffffffffffffab4[0x1bf];
  rhs_03.Reserved[0x48] = in_stack_fffffffffffffab4[0x1c0];
  rhs_03.Reserved[0x49] = in_stack_fffffffffffffab4[0x1c1];
  rhs_03.Reserved[0x4a] = in_stack_fffffffffffffab4[0x1c2];
  rhs_03.Reserved[0x4b] = in_stack_fffffffffffffab4[0x1c3];
  rhs_03.Reserved[0x4c] = in_stack_fffffffffffffab4[0x1c4];
  rhs_03.Reserved[0x4d] = in_stack_fffffffffffffab4[0x1c5];
  rhs_03.Reserved[0x4e] = in_stack_fffffffffffffab4[0x1c6];
  rhs_03.Reserved[0x4f] = in_stack_fffffffffffffab4[0x1c7];
  rhs_03.Reserved[0x50] = in_stack_fffffffffffffab4[0x1c8];
  rhs_03.Reserved[0x51] = in_stack_fffffffffffffab4[0x1c9];
  rhs_03.Reserved[0x52] = in_stack_fffffffffffffab4[0x1ca];
  rhs_03.Reserved[0x53] = in_stack_fffffffffffffab4[0x1cb];
  rhs_03.Reserved[0x54] = in_stack_fffffffffffffab4[0x1cc];
  rhs_03.Reserved[0x55] = in_stack_fffffffffffffab4[0x1cd];
  rhs_03.Reserved[0x56] = in_stack_fffffffffffffab4[0x1ce];
  rhs_03.Reserved[0x57] = in_stack_fffffffffffffab4[0x1cf];
  rhs_03.Reserved[0x58] = in_stack_fffffffffffffab4[0x1d0];
  rhs_03.Reserved[0x59] = in_stack_fffffffffffffab4[0x1d1];
  rhs_03.Reserved[0x5a] = in_stack_fffffffffffffab4[0x1d2];
  rhs_03.Reserved[0x5b] = in_stack_fffffffffffffab4[0x1d3];
  rhs_03.Reserved[0x5c] = in_stack_fffffffffffffab4[0x1d4];
  rhs_03.Reserved[0x5d] = in_stack_fffffffffffffab4[0x1d5];
  rhs_03.Reserved[0x5e] = in_stack_fffffffffffffab4[0x1d6];
  rhs_03.Reserved[0x5f] = in_stack_fffffffffffffab4[0x1d7];
  rhs_03.Reserved[0x60] = in_stack_fffffffffffffab4[0x1d8];
  rhs_03.Reserved[0x61] = in_stack_fffffffffffffab4[0x1d9];
  rhs_03.Reserved[0x62] = in_stack_fffffffffffffab4[0x1da];
  rhs_03.Reserved[99] = in_stack_fffffffffffffab4[0x1db];
  rhs_03.Reserved[100] = in_stack_fffffffffffffab4[0x1dc];
  rhs_03.Reserved[0x65] = in_stack_fffffffffffffab4[0x1dd];
  rhs_03.Reserved[0x66] = in_stack_fffffffffffffab4[0x1de];
  rhs_03.Reserved[0x67] = in_stack_fffffffffffffab4[0x1df];
  rhs_03.Reserved[0x68] = in_stack_fffffffffffffab4[0x1e0];
  rhs_03.Reserved[0x69] = in_stack_fffffffffffffab4[0x1e1];
  rhs_03.Reserved[0x6a] = in_stack_fffffffffffffab4[0x1e2];
  rhs_03.Reserved[0x6b] = in_stack_fffffffffffffab4[0x1e3];
  rhs_03.Reserved[0x6c] = in_stack_fffffffffffffab4[0x1e4];
  rhs_03.Reserved[0x6d] = in_stack_fffffffffffffab4[0x1e5];
  rhs_03.Reserved[0x6e] = in_stack_fffffffffffffab4[0x1e6];
  rhs_03.Reserved[0x6f] = in_stack_fffffffffffffab4[0x1e7];
  rhs_03.Reserved[0x70] = in_stack_fffffffffffffab4[0x1e8];
  rhs_03.Reserved[0x71] = in_stack_fffffffffffffab4[0x1e9];
  rhs_03.Reserved[0x72] = in_stack_fffffffffffffab4[0x1ea];
  rhs_03.Reserved[0x73] = in_stack_fffffffffffffab4[0x1eb];
  rhs_03.Reserved[0x74] = in_stack_fffffffffffffab4[0x1ec];
  rhs_03.Reserved[0x75] = in_stack_fffffffffffffab4[0x1ed];
  rhs_03.Reserved[0x76] = in_stack_fffffffffffffab4[0x1ee];
  rhs_03.Reserved[0x77] = in_stack_fffffffffffffab4[0x1ef];
  rhs_03.Reserved[0x78] = in_stack_fffffffffffffab4[0x1f0];
  rhs_03.Reserved[0x79] = in_stack_fffffffffffffab4[0x1f1];
  rhs_03.Reserved[0x7a] = in_stack_fffffffffffffab4[0x1f2];
  rhs_03.Reserved[0x7b] = in_stack_fffffffffffffab4[499];
  rhs_03.Reserved[0x7c] = in_stack_fffffffffffffab4[500];
  rhs_03.Reserved[0x7d] = in_stack_fffffffffffffab4[0x1f5];
  rhs_03.Reserved[0x7e] = in_stack_fffffffffffffab4[0x1f6];
  rhs_03.Reserved[0x7f] = in_stack_fffffffffffffab4[0x1f7];
  rhs_03.Reserved[0x80] = in_stack_fffffffffffffab4[0x1f8];
  rhs_03.Reserved[0x81] = in_stack_fffffffffffffab4[0x1f9];
  rhs_03.Reserved[0x82] = in_stack_fffffffffffffab4[0x1fa];
  rhs_03.Reserved[0x83] = in_stack_fffffffffffffab4[0x1fb];
  rhs_03.Reserved[0x84] = in_stack_fffffffffffffab4[0x1fc];
  rhs_03.Reserved[0x85] = in_stack_fffffffffffffab4[0x1fd];
  rhs_03.Reserved[0x86] = in_stack_fffffffffffffab4[0x1fe];
  rhs_03.Reserved[0x87] = in_stack_fffffffffffffab4[0x1ff];
  rhs_03.Reserved[0x88] = in_stack_fffffffffffffab4[0x200];
  rhs_03.Reserved[0x89] = in_stack_fffffffffffffab4[0x201];
  rhs_03.Reserved[0x8a] = in_stack_fffffffffffffab4[0x202];
  rhs_03.Reserved[0x8b] = in_stack_fffffffffffffab4[0x203];
  rhs_03.Reserved[0x8c] = in_stack_fffffffffffffab4[0x204];
  rhs_03.Reserved[0x8d] = in_stack_fffffffffffffab4[0x205];
  rhs_03.Reserved[0x8e] = in_stack_fffffffffffffab4[0x206];
  rhs_03.Reserved[0x8f] = in_stack_fffffffffffffab4[0x207];
  rhs_03.Reserved[0x90] = in_stack_fffffffffffffab4[0x208];
  rhs_03.Reserved[0x91] = in_stack_fffffffffffffab4[0x209];
  rhs_03.Reserved[0x92] = in_stack_fffffffffffffab4[0x20a];
  rhs_03.Reserved[0x93] = in_stack_fffffffffffffab4[0x20b];
  rhs_03.Reserved[0x94] = in_stack_fffffffffffffab4[0x20c];
  rhs_03.Reserved[0x95] = in_stack_fffffffffffffab4[0x20d];
  rhs_03.Reserved[0x96] = in_stack_fffffffffffffab4[0x20e];
  rhs_03.Reserved[0x97] = in_stack_fffffffffffffab4[0x20f];
  rhs_03.Reserved[0x98] = in_stack_fffffffffffffab4[0x210];
  rhs_03.Reserved[0x99] = in_stack_fffffffffffffab4[0x211];
  rhs_03.Reserved[0x9a] = in_stack_fffffffffffffab4[0x212];
  rhs_03.Reserved[0x9b] = in_stack_fffffffffffffab4[0x213];
  rhs_03.Reserved[0x9c] = in_stack_fffffffffffffab4[0x214];
  rhs_03.Reserved[0x9d] = in_stack_fffffffffffffab4[0x215];
  rhs_03.Reserved[0x9e] = in_stack_fffffffffffffab4[0x216];
  rhs_03.Reserved[0x9f] = in_stack_fffffffffffffab4[0x217];
  rhs_03.Reserved[0xa0] = in_stack_fffffffffffffab4[0x218];
  rhs_03.Reserved[0xa1] = in_stack_fffffffffffffab4[0x219];
  rhs_03.Reserved[0xa2] = in_stack_fffffffffffffab4[0x21a];
  rhs_03.Reserved[0xa3] = in_stack_fffffffffffffab4[0x21b];
  rhs_03.Reserved[0xa4] = in_stack_fffffffffffffab4[0x21c];
  rhs_03.Reserved[0xa5] = in_stack_fffffffffffffab4[0x21d];
  rhs_03.Reserved[0xa6] = in_stack_fffffffffffffab4[0x21e];
  rhs_03.Reserved[0xa7] = in_stack_fffffffffffffab4[0x21f];
  rhs_03.Reserved[0xa8] = in_stack_fffffffffffffab4[0x220];
  rhs_03.Reserved[0xa9] = in_stack_fffffffffffffab4[0x221];
  rhs_03.Reserved[0xaa] = in_stack_fffffffffffffab4[0x222];
  rhs_03.Reserved[0xab] = in_stack_fffffffffffffab4[0x223];
  rhs_03.Reserved[0xac] = (char)in_stack_fffffffffffffcd8;
  rhs_03.Reserved[0xad] = (char)((ulong)in_stack_fffffffffffffcd8 >> 8);
  rhs_03.Reserved[0xae] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x10);
  rhs_03.Reserved[0xaf] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x18);
  rhs_03.Reserved[0xb0] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  rhs_03.Reserved[0xb1] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x28);
  rhs_03.Reserved[0xb2] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x30);
  rhs_03.Reserved[0xb3] = (char)((ulong)in_stack_fffffffffffffcd8 >> 0x38);
  PrintBextChunk(rhs_03);
  local_598 = *(undefined8 *)&local_10->DataChunk;
  rhs.ckSize._0_4_ = uVar6;
  rhs.ckID = (char  [4])*(undefined4 *)((long)&(local_10->DataChunk).ckSize + 4);
  rhs.ckSize._4_4_ = uVar7;
  PrintDataChunk(rhs);
  return;
}

Assistant:

void WavParserHelper::PrintRF64Header(RF64Header *wavHeader)
{
	PrintRF64Chunk(wavHeader->RF64Chunk);
	PrintDS64Chunk(wavHeader->DS64Chunk);
	PrintExtensibleFmtChunk(wavHeader->fmtChunk);
	PrintBextChunk(wavHeader->BextChunk);
	//PrintJunkChunk(wavHeader->JunkChunk);
	PrintDataChunk(wavHeader->DataChunk);
}